

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableReorderDrawChannelsForMerge(ImGuiTable *table)

{
  ImVector<ImDrawCmd> *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVector<ImDrawCmd> IVar6;
  char cVar7;
  char cVar8;
  short sVar9;
  undefined2 uVar10;
  ImU32 IVar11;
  ImDrawCmd *pIVar12;
  ImDrawChannel *pIVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  undefined8 uVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  short sVar19;
  uint uVar20;
  long lVar21;
  ImDrawChannel *pIVar22;
  byte bVar23;
  int n;
  undefined4 uVar24;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  char *pcVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ImU32 IVar32;
  ImGuiTableColumn *pIVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  float *pfVar37;
  ImBitArray<130> *pIVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  ImBitArray<130> remaining_mask;
  MergeGroup merge_groups [4];
  ImDrawChannel *local_180;
  ulong local_168;
  undefined1 local_148 [80];
  ImBitArray<130> local_f8;
  float local_d8 [2];
  undefined8 local_d0;
  ImU32 local_c8;
  ImBitArray<130> local_c4 [7];
  undefined1 auVar42 [16];
  
  pIVar17 = GImGui;
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  lVar21 = 0;
  do {
    *(undefined8 *)((long)local_d8 + lVar21) = 0;
    *(undefined8 *)((long)&local_d0 + lVar21) = 0;
    lVar21 = lVar21 + 0x28;
  } while (lVar21 != 0xa0);
  uVar20 = 0;
  memset(local_d8,0,0xa0);
  uVar25 = table->Flags;
  if (0 < table->ColumnsCount) {
    uVar26 = 0;
    uVar20 = 0;
    do {
      if ((table->VisibleUnclippedMaskByIndex >> (uVar26 & 0x3f) & 1) != 0) {
        pIVar33 = (table->Columns).Data + uVar26;
        if ((table->Columns).DataEnd <= pIVar33) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_internal.h"
                      ,0x1fa,"operator[]","ImGui ASSERT FAILED: %s","p < DataEnd");
        }
        iVar36 = 0;
        do {
          iVar34 = (int)*(char *)((long)pIVar33 + (0x5e - (ulong)(iVar36 == 0)));
          if ((table->DrawSplitter)._Channels.Size <= iVar34) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          }
          pIVar22 = (table->DrawSplitter)._Channels.Data;
          pIVar13 = pIVar22 + iVar34;
          if ((0 < pIVar22[iVar34]._CmdBuffer.Size) &&
             (iVar31 = (pIVar13->_CmdBuffer).Size,
             (pIVar13->_CmdBuffer).Data[(long)iVar31 + -1].ElemCount == 0)) {
            if (iVar31 < 1) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x61a,"pop_back","ImGui ASSERT FAILED: %s","Size > 0");
            }
            (pIVar13->_CmdBuffer).Size = (pIVar13->_CmdBuffer).Size + -1;
          }
          if ((pIVar13->_CmdBuffer).Size == 1) {
            if ((pIVar33->Flags & 0x40) == 0) {
              if (cVar7 < '\x01') {
                sVar9 = pIVar33->ContentWidthRowsUnfrozen;
LAB_001f28e8:
                uVar10 = pIVar33->ContentWidthHeadersUsed;
                sVar19 = uVar10;
                if ((short)uVar10 < sVar9) {
                  sVar19 = sVar9;
                }
              }
              else {
                if (iVar36 == 0) {
                  sVar9 = pIVar33->ContentWidthRowsFrozen;
                  goto LAB_001f28e8;
                }
                sVar19 = pIVar33->ContentWidthRowsUnfrozen;
              }
              if (pIVar33->WidthGiven <= (float)(int)sVar19 &&
                  (float)(int)sVar19 != pIVar33->WidthGiven) goto LAB_001f29fe;
            }
            if (cVar8 < '\x01') {
              iVar31 = 2;
            }
            else {
              iVar31 = (uint)((long)table->FreezeColumnsCount <= (long)uVar26) * 2;
            }
            iVar29 = iVar36;
            if (cVar7 < '\x01') {
              iVar29 = 1;
            }
            uVar30 = (ulong)(uint)(iVar29 + iVar31);
            pfVar37 = local_d8 + uVar30 * 10;
            if (local_c4[uVar30 * 2 + -1].Storage[4] == 0) {
              pfVar37[0] = 3.4028235e+38;
              pfVar37[1] = 3.4028235e+38;
              (&local_d0)[uVar30 * 5] = 0xff7fffffff7fffff;
            }
            ImBitArray<130>::SetBit(local_c4 + uVar30 * 2,iVar34);
            local_c4[uVar30 * 2 + -1].Storage[4] = local_c4[uVar30 * 2 + -1].Storage[4] + 1;
            if ((pIVar13->_CmdBuffer).Size < 1) {
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                          ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
            }
            pIVar12 = (pIVar13->_CmdBuffer).Data;
            fVar2 = (pIVar12->ClipRect).x;
            fVar3 = (pIVar12->ClipRect).y;
            fVar4 = (pIVar12->ClipRect).z;
            fVar5 = (pIVar12->ClipRect).w;
            if (fVar2 < *pfVar37) {
              *pfVar37 = fVar2;
            }
            if (fVar3 < local_d8[uVar30 * 10 + 1]) {
              local_d8[uVar30 * 10 + 1] = fVar3;
            }
            if (*(float *)(&local_d0 + uVar30 * 5) <= fVar4 &&
                fVar4 != *(float *)(&local_d0 + uVar30 * 5)) {
              *(float *)(&local_d0 + uVar30 * 5) = fVar4;
            }
            pfVar37 = (float *)((long)&local_d0 + uVar30 * 0x28 + 4);
            if (*pfVar37 <= fVar5 && fVar5 != *pfVar37) {
              *(float *)((long)&local_d0 + uVar30 * 0x28 + 4) = fVar5;
            }
            uVar20 = uVar20 | 1 << iVar29 + iVar31;
          }
LAB_001f29fe:
        } while ((iVar36 == 0) && (iVar36 = 1, '\0' < cVar7));
        pIVar33->DrawChannelCurrent = -1;
      }
      uVar26 = uVar26 + 1;
    } while ((long)uVar26 < (long)table->ColumnsCount);
  }
  if (uVar20 != 0) {
    iVar34 = (table->DrawSplitter)._Count + -1;
    iVar36 = (pIVar17->DrawChannelsTempMergeBuffer).Capacity;
    if (iVar36 < iVar34) {
      if (iVar36 == 0) {
        iVar31 = 8;
      }
      else {
        iVar31 = iVar36 / 2 + iVar36;
      }
      if (iVar31 <= iVar34) {
        iVar31 = iVar34;
      }
      if (iVar36 < iVar31) {
        pIVar22 = (ImDrawChannel *)MemAlloc((long)iVar31 << 5);
        pIVar13 = (pIVar17->DrawChannelsTempMergeBuffer).Data;
        if (pIVar13 != (ImDrawChannel *)0x0) {
          memcpy(pIVar22,pIVar13,(long)(pIVar17->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar17->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar17->DrawChannelsTempMergeBuffer).Data = pIVar22;
        (pIVar17->DrawChannelsTempMergeBuffer).Capacity = iVar31;
      }
    }
    (pIVar17->DrawChannelsTempMergeBuffer).Size = iVar34;
    local_180 = (pIVar17->DrawChannelsTempMergeBuffer).Data;
    local_f8.Storage[0] = 0;
    local_f8.Storage[1] = 0;
    local_f8.Storage[2] = 0;
    local_f8.Storage[3] = 0;
    local_f8.Storage[4] = 0;
    ImBitArray<130>::SetBitRange(&local_f8,1,(table->DrawSplitter)._Count + -1);
    iVar36 = (table->DrawSplitter)._Count + -1;
    uVar26 = (ulong)((uVar25 >> 0x12 & 1) == 0) << 5 | 0x104;
    pIVar38 = local_c4;
    lVar21 = 0;
    do {
      IVar32 = local_c4[lVar21 * 2 + -1].Storage[4];
      if (IVar32 != 0) {
        local_148._0_8_ = *(undefined8 *)(local_d8 + lVar21 * 10);
        local_148._8_8_ = 0;
        local_168 = (&local_d0)[lVar21 * 5];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_168;
        if (uVar20 == 8 && (cVar7 < '\x01' && cVar8 < '\x01')) {
          if (lVar21 != 3) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                        ,0x2448,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                        "merge_group_n == 3");
          }
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)&table->ID + uVar26);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)((long)&(table->RawData).Size + uVar26);
          auVar39 = minps(auVar39,local_148._0_16_);
          local_148._0_8_ = auVar39._0_8_;
          auVar41 = maxps(auVar40,auVar41);
          local_168 = auVar41._0_8_;
        }
        IVar11 = local_c4[lVar21 * 2 + -1].Storage[4];
        lVar27 = 0;
        do {
          local_f8.Storage[lVar27] = local_f8.Storage[lVar27] & ~pIVar38->Storage[lVar27];
          lVar27 = lVar27 + 1;
        } while (lVar27 != 5);
        iVar36 = iVar36 - IVar11;
        if (0 < (table->DrawSplitter)._Count) {
          lVar35 = 0;
          lVar27 = 0;
          pcVar28 = (char *)0x5;
          do {
            bVar18 = ImBitArray<130>::TestBit(local_c4 + lVar21 * 2,(int)lVar27);
            uVar24 = SUB84(pcVar28,0);
            if (bVar18) {
              ImBitArray<130>::ClearBit(local_c4 + lVar21 * 2,(int)lVar27);
              if ((table->DrawSplitter)._Channels.Size <= lVar27) {
                uVar24 = 0x284589;
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                            ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
              }
              pIVar13 = (table->DrawSplitter)._Channels.Data;
              if (*(int *)((long)&(pIVar13->_CmdBuffer).Size + lVar35) == 1) {
                puVar14 = *(undefined8 **)((long)&(pIVar13->_CmdBuffer).Data + lVar35);
                iVar34 = -(uint)((float)*puVar14 < (float)local_148._0_4_);
                iVar31 = -(uint)((float)((ulong)*puVar14 >> 0x20) < (float)local_148._4_4_);
                auVar43._4_4_ = iVar31;
                auVar43._0_4_ = iVar34;
                auVar43._8_4_ = iVar31;
                auVar43._12_4_ = iVar31;
                auVar42._8_8_ = auVar43._8_8_;
                auVar42._4_4_ = iVar34;
                auVar42._0_4_ = iVar34;
                uVar25 = movmskpd(uVar24,auVar42);
                if (((((uVar25 & 1) != 0) ||
                     (bVar23 = (byte)uVar25 >> 1,
                     pcVar28 = (char *)(ulong)CONCAT31((int3)(uVar25 >> 8),bVar23), bVar23 != 0)) ||
                    ((float)local_168 < *(float *)(puVar14 + 1))) ||
                   ((float)(local_168 >> 0x20) < *(float *)((long)puVar14 + 0xc)))
                goto LAB_001f2ce4;
              }
              else {
LAB_001f2ce4:
                pcVar28 = "ImGui ASSERT FAILED: %s";
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                            ,0x245b,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                            "channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect))"
                           );
              }
              pIVar1 = (ImVector<ImDrawCmd> *)((long)&(pIVar13->_CmdBuffer).Size + lVar35);
              if (pIVar1->Size < 1) {
                pcVar28 = "ImGui ASSERT FAILED: %s";
                LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                            ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
              }
              IVar32 = IVar32 - 1;
              puVar15 = *(ulong **)((long)&(pIVar13->_CmdBuffer).Data + lVar35);
              *puVar15 = local_148._0_8_;
              puVar15[1] = local_168;
              IVar6 = *pIVar1;
              iVar34 = pIVar1[1].Capacity;
              pIVar12 = pIVar1[1].Data;
              (local_180->_IdxBuffer).Size = pIVar1[1].Size;
              (local_180->_IdxBuffer).Capacity = iVar34;
              (local_180->_IdxBuffer).Data = (unsigned_short *)pIVar12;
              local_180->_CmdBuffer = IVar6;
              local_180 = local_180 + 1;
            }
            lVar27 = lVar27 + 1;
          } while ((lVar27 < (table->DrawSplitter)._Count) && (lVar35 = lVar35 + 0x20, IVar32 != 0))
          ;
        }
      }
      lVar21 = lVar21 + 1;
      pIVar38 = pIVar38 + 2;
    } while (lVar21 != 4);
    if ((0 < (table->DrawSplitter)._Count) && (iVar36 != 0)) {
      lVar21 = 0;
      lVar27 = 0;
      do {
        bVar18 = ImBitArray<130>::TestBit(&local_f8,(int)lVar27);
        if (bVar18) {
          if ((table->DrawSplitter)._Channels.Size <= lVar27) {
            LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                        ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
          }
          pIVar13 = (table->DrawSplitter)._Channels.Data;
          puVar14 = (undefined8 *)((long)&(pIVar13->_CmdBuffer).Size + lVar21);
          uVar16 = *puVar14;
          pIVar12 = (ImDrawCmd *)puVar14[1];
          local_180->_IdxBuffer =
               *(ImVector<unsigned_short> *)((long)&(pIVar13->_IdxBuffer).Size + lVar21);
          (local_180->_CmdBuffer).Size = (int)uVar16;
          (local_180->_CmdBuffer).Capacity = (int)((ulong)uVar16 >> 0x20);
          (local_180->_CmdBuffer).Data = pIVar12;
          local_180 = local_180 + 1;
          iVar36 = iVar36 + -1;
        }
        lVar27 = lVar27 + 1;
      } while ((lVar27 < (table->DrawSplitter)._Count) && (lVar21 = lVar21 + 0x20, iVar36 != 0));
    }
    if (local_180 !=
        (pIVar17->DrawChannelsTempMergeBuffer).Data + (pIVar17->DrawChannelsTempMergeBuffer).Size) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                  ,0x246a,"TableReorderDrawChannelsForMerge","ImGui ASSERT FAILED: %s",
                  "dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size"
                 );
    }
    memcpy((table->DrawSplitter)._Channels.Data + 1,(pIVar17->DrawChannelsTempMergeBuffer).Data,
           (long)(table->DrawSplitter)._Count * 0x20 - 0x20);
  }
  return;
}

Assistant:

void    ImGui::TableReorderDrawChannelsForMerge(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool is_frozen_v = (table->FreezeRowsCount > 0);
    const bool is_frozen_h = (table->FreezeColumnsCount > 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));
    bool merge_groups_all_fit_within_inner_rect = (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0;

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleUnclippedMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = is_frozen_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelRowsBeforeFreeze : column->DrawChannelRowsAfterFreeze;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column.
            if (!(column->Flags & ImGuiTableColumnFlags_NoClipX))
            {
                float width_contents;
                if (merge_group_sub_count == 1)     // No row freeze (same as testing !is_frozen_v)
                    width_contents = ImMax(column->ContentWidthRowsUnfrozen, column->ContentWidthHeadersUsed);
                else if (merge_group_sub_n == 0)    // Row freeze: use width before freeze
                    width_contents = ImMax(column->ContentWidthRowsFrozen, column->ContentWidthHeadersUsed);
                else                                // Row freeze: use width after freeze
                    width_contents = column->ContentWidthRowsUnfrozen;
                if (width_contents > column->WidthGiven)
                    continue;
            }

            const int merge_group_dst_n = (is_frozen_h && column_n < table->FreezeColumnsCount ? 0 : 2) + (is_frozen_v ? merge_group_sub_n : 1);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_dst_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_dst_n);

            // If we end with a single group and hosted by the outer window, we'll attempt to merge our draw command
            // with the existing outer window command. But we can only do so if our columns all fit within the expected
            // clip rect, otherwise clipping will be incorrect when ScrollX is disabled.
            // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column don't fit within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect

            // 2019/10/22: (1) This is breaking table_2_draw_calls but I cannot seem to repro what it is attempting to
            // fix... cf git fce2e8dc "Fixed issue with clipping when outerwindow==innerwindow / support ScrollH without ScrollV."
            // 2019/10/22: (2) Clamping code in TableUpdateLayout() seemingly made this not necessary...
#if 0
            if (column->MinX < table->InnerClipRect.Min.x || column->MaxX > table->InnerClipRect.Max.x)
                merge_groups_all_fit_within_inner_rect = false;
#endif
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelBeforeRowFreeze/DrawChannelAfterRowFreeze solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = -1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // Conceptually we want to test if only 1 bit of merge_group_mask is set, but with no freezing we know it's always going to be group 3.
        // We need to test for !is_frozen because any unfitting column will not be part of a merge group, so testing for merge_group_mask isn't enough.
        const bool may_extend_clip_rect_to_host_rect = (merge_group_mask == (1 << 3)) && !is_frozen_v && !is_frozen_h;

        // Use shared temporary storage so the allocation gets amortized
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - 1);
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask; // We need 130-bit of storage
        remaining_mask.ClearBits();
        remaining_mask.SetBitRange(1, splitter->_Count - 1); // Background channel 0 not part of the merge (see channel allocation in TableUpdateDrawChannels)
        int remaining_count = splitter->_Count - 1;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_groups[merge_group_n].ClipRect;
                if (may_extend_clip_rect_to_host_rect)
                {
                    IM_ASSERT(merge_group_n == 3);
                    //GetOverlayDrawList()->AddRect(table->HostClipRect.Min, table->HostClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 3.0f);
                    //GetOverlayDrawList()->AddRect(table->InnerClipRect.Min, table->InnerClipRect.Max, IM_COL32(0, 255, 0, 200), 0.0f, ~0, 1.0f);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 2.0f);
                    merge_clip_rect.Add(merge_groups_all_fit_within_inner_rect ? table->HostClipRect : table->InnerClipRect);
                    //GetOverlayDrawList()->AddRect(merge_clip_rect.Min, merge_clip_rect.Max, IM_COL32(0, 255, 0, 200));
                }
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + 1, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - 1) * sizeof(ImDrawChannel));
    }
}